

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransportElement::~IfcTransportElement(IfcTransportElement *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x89c360;
  *(undefined8 *)&this->field_0x190 = 0x89c450;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x89c388;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x89c3b0;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x89c3d8;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.field_0x100 = 0x89c400;
  *(undefined8 *)&(this->super_IfcElement).field_0x138 = 0x89c428;
  puVar1 = *(undefined1 **)&(this->super_IfcElement).field_0x148;
  if (puVar1 != &this->field_0x158) {
    operator_delete(puVar1,*(long *)&this->field_0x158 + 1);
  }
  IfcElement::~IfcElement(&this->super_IfcElement,&PTR_construction_vtable_24__0089c468);
  operator_delete(this,0x1a8);
  return;
}

Assistant:

IfcTransportElement() : Object("IfcTransportElement") {}